

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_common.c
# Opt level: O0

void sylvan_set_sizes(size_t min_tablesize,size_t max_tablesize,size_t min_cachesize,
                     size_t max_cachesize)

{
  int iVar1;
  size_t max_cachesize_local;
  size_t min_cachesize_local;
  size_t max_tablesize_local;
  size_t min_tablesize_local;
  
  max_tablesize_local = min_tablesize;
  if (max_tablesize < min_tablesize) {
    max_tablesize_local = max_tablesize;
  }
  max_cachesize_local = min_cachesize;
  if (max_cachesize < min_cachesize) {
    max_cachesize_local = max_cachesize;
  }
  iVar1 = is_power_of_two(max_tablesize_local);
  if (iVar1 != 0) {
    iVar1 = is_power_of_two(max_tablesize);
    if (iVar1 != 0) {
      iVar1 = is_power_of_two(max_cachesize_local);
      if (iVar1 != 0) {
        iVar1 = is_power_of_two(max_cachesize);
        if (iVar1 != 0) {
          if (0x40000000000 < max_tablesize) {
            fprintf(_stderr,"sylvan_set_sizes error: tablesize must be <= 42 bits!\n");
            exit(1);
          }
          table_min = max_tablesize_local;
          table_max = max_tablesize;
          cache_min = max_cachesize_local;
          cache_max = max_cachesize;
          return;
        }
      }
    }
  }
  fprintf(_stderr,"sylvan_set_sizes error: parameters not powers of 2!\n");
  exit(1);
}

Assistant:

void
sylvan_set_sizes(size_t min_tablesize, size_t max_tablesize, size_t min_cachesize, size_t max_cachesize)
{
    /* Some sanity checks */
    if (min_tablesize > max_tablesize) min_tablesize = max_tablesize;
    if (min_cachesize > max_cachesize) min_cachesize = max_cachesize;

    if (!is_power_of_two(min_tablesize) || !is_power_of_two(max_tablesize) ||
        !is_power_of_two(min_cachesize) || !is_power_of_two(max_cachesize)) {
        fprintf(stderr, "sylvan_set_sizes error: parameters not powers of 2!\n");
        exit(1);
    }

    if (max_tablesize > 0x0000040000000000) {
        fprintf(stderr, "sylvan_set_sizes error: tablesize must be <= 42 bits!\n");
        exit(1);
    }

    table_min = min_tablesize;
    table_max = max_tablesize;
    cache_min = min_cachesize;
    cache_max = max_cachesize;
}